

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureViewVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::TextureViewVkImpl::~TextureViewVkImpl(TextureViewVkImpl *this)

{
  ~TextureViewVkImpl(this);
  free(this);
  return;
}

Assistant:

TextureViewVkImpl::~TextureViewVkImpl()
{
    if (FramebufferCache* FBCache = m_pDevice->GetFramebufferCache())
    {
        if (m_Desc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL ||
            m_Desc.ViewType == TEXTURE_VIEW_RENDER_TARGET ||
            m_Desc.ViewType == TEXTURE_VIEW_SHADING_RATE)
        {
            FBCache->OnDestroyImageView(m_ImageView);
        }
    }
    m_pDevice->SafeReleaseDeviceObject(std::move(m_ImageView), m_pTexture->GetDesc().ImmediateContextMask);
}